

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O1

int tclpkcs11_pkinfo(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  tclpkcs11_handle *handle;
  _func_char_ptr_uint *p_Var1;
  long lVar2;
  long *data;
  _func_int_Tcl_Interp_ptr_Tcl_Obj_ptr_Tcl_Obj_ptr *p_Var3;
  int iVar4;
  long lVar5;
  uchar *outbuf;
  Tcl_Obj *pTVar6;
  char *pcVar7;
  Tcl_Obj *pTVar8;
  Tcl_Obj *pTVar9;
  Tcl_Obj *pTVar10;
  long *plVar11;
  CK_RV CVar12;
  ProcErrorProc *pPVar13;
  CK_OBJECT_HANDLE hObject;
  CK_ULONG foundObjs;
  long slotid_long;
  CK_OBJECT_CLASS objectclass_pk;
  CK_ATTRIBUTE template [2];
  CK_ATTRIBUTE templ_pk [8];
  Tcl_Obj *local_180;
  Tcl_Obj *local_178;
  Tcl_Obj *local_170;
  Tcl_Obj *local_168;
  CK_OBJECT_HANDLE local_160;
  Tcl_Obj *local_158;
  Tcl_Obj *local_150;
  Tcl_Obj *local_148;
  CK_ULONG local_140;
  CK_SLOT_ID local_138 [2];
  CK_ATTRIBUTE local_128;
  undefined8 uStack_110;
  CK_SLOT_ID *local_108 [2];
  CK_ATTRIBUTE local_f8 [8];
  
  local_128.pValue = (uchar *)0x0;
  local_108[0] = (CK_SLOT_ID *)0x0;
  local_108[1] = (CK_SLOT_ID *)0x0;
  local_128.ulValueLen = 0;
  uStack_110 = 0;
  local_128.type = 0x102;
  memcpy(local_f8,&DAT_0010c490,0xc0);
  if (objc == 4) {
    pTVar6 = objv[1];
    pTVar8 = objv[2];
    pTVar9 = objv[3];
    lVar5 = (**(code **)((long)cd + 0x40))(cd,pTVar6);
    if ((lVar5 != 0) &&
       (handle = *(tclpkcs11_handle **)(lVar5 + 0x18), handle != (tclpkcs11_handle *)0x0)) {
      iVar4 = (*tclStubsPtr->tcl_GetLongFromObj)
                        ((Tcl_Interp_conflict *)interp,pTVar8,(long *)local_138);
      if (iVar4 != 0) {
        return iVar4;
      }
      local_148 = pTVar8;
      iVar4 = tclpkcs11_start_session(handle,local_138[0]);
      if (iVar4 == 0) {
        p_Var1 = tclStubsPtr->tcl_Alloc;
        iVar4 = (*tclStubsPtr->tcl_GetCharLength)(pTVar9);
        outbuf = (uchar *)(*p_Var1)(iVar4 / 2);
        local_128.pValue = outbuf;
        iVar4 = (*tclStubsPtr->tcl_GetCharLength)(pTVar9);
        local_128.ulValueLen = tclpkcs11_string_to_bytearray(pTVar9,outbuf,(long)(iVar4 / 2));
        local_108[0] = local_138 + 1;
        local_138[1] = 2;
        local_108[1] = (CK_SLOT_ID *)0x8;
        CVar12 = (*handle->pkcs11->C_FindObjectsInit)(handle->session,&local_128,2);
        if (CVar12 == 0) {
          CVar12 = (*handle->pkcs11->C_FindObjects)(handle->session,&local_160,1,&local_140);
          if (CVar12 != 0) {
            pPVar13 = tclStubsPtr->tcl_SetObjResult;
            pTVar6 = tclpkcs11_pkcs11_error(CVar12);
LAB_00106851:
            (*pPVar13)((Tcl_Interp_conflict *)interp,pTVar6);
            (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
            return 1;
          }
          (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
          if (local_140 != 0) {
            if (local_140 == 1) {
              lVar5 = 8;
              do {
                pcVar7 = *(char **)((long)&local_f8[0].type + lVar5);
                if (pcVar7 != (char *)0x0) {
                  (*tclStubsPtr->tcl_Free)(pcVar7);
                }
                *(undefined8 *)((long)&local_f8[0].type + lVar5) = 0;
                *(undefined8 *)((long)&local_f8[0].pValue + lVar5) = 0;
                lVar5 = lVar5 + 0x18;
              } while (lVar5 != 200);
              CVar12 = (*handle->pkcs11->C_GetAttributeValue)(handle->session,local_160,local_f8,8);
              if (((0x12 < CVar12) || ((0x60001UL >> (CVar12 & 0x3f) & 1) == 0)) &&
                 (CVar12 != 0x150)) {
                return 1;
              }
              lVar5 = 0x10;
              do {
                lVar2 = *(long *)((long)&local_f8[0].type + lVar5);
                if (lVar2 != -1) {
                  pcVar7 = (*tclStubsPtr->tcl_Alloc)((uint)lVar2);
                  *(char **)((long)local_f8 + lVar5 + -8) = pcVar7;
                }
                lVar5 = lVar5 + 0x18;
              } while (lVar5 != 0xd0);
              CVar12 = (*handle->pkcs11->C_GetAttributeValue)(handle->session,local_160,local_f8,8);
              if (((0x12 < CVar12) || ((0x60001UL >> (CVar12 & 0x3f) & 1) == 0)) &&
                 (CVar12 != 0x150)) {
                lVar5 = 8;
                do {
                  pcVar7 = *(char **)((long)&local_f8[0].type + lVar5);
                  if (pcVar7 != (char *)0x0) {
                    (*tclStubsPtr->tcl_Free)(pcVar7);
                  }
                  lVar5 = lVar5 + 0x18;
                } while (lVar5 != 200);
                pPVar13 = tclStubsPtr->tcl_SetObjResult;
                pTVar6 = tclpkcs11_pkcs11_error(CVar12);
                (*pPVar13)((Tcl_Interp_conflict *)interp,pTVar6);
                (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
                return 1;
              }
              lVar5 = 0x10;
              plVar11 = (long *)0x0;
              local_178 = (Tcl_Obj *)0x0;
              pTVar8 = (Tcl_Obj *)0x0;
              local_170 = (Tcl_Obj *)0x0;
              do {
                data = *(long **)((long)local_f8 + lVar5 + -8);
                if (data != (long *)0x0) {
                  lVar2 = *(long *)((long)local_108 + lVar5);
                  if (lVar2 < 0x102) {
                    if (lVar2 < 0x11) {
                      if (lVar2 == 0) {
                        plVar11 = data;
                        if (*data != 2) goto LAB_00106bad;
                      }
                      else if (lVar2 == 3) {
                        local_170 = (*tclStubsPtr->tcl_NewStringObj)
                                              ((char *)data,
                                               *(int *)((long)&local_f8[0].type + lVar5));
                      }
                    }
                    else if (lVar2 == 0x11) {
                      if (plVar11 == (long *)0x0) {
                        plVar11 = (long *)0x0;
                      }
                      else {
                        local_178 = tclpkcs11_bytearray_to_string
                                              ((uchar *)data,
                                               *(unsigned_long *)((long)&local_f8[0].type + lVar5));
                      }
                    }
                    else if (lVar2 == 0x100) {
                      if (*data == 0xd4321003) {
                        local_180 = (*tclStubsPtr->tcl_NewStringObj)("1 2 643 7 1 1 1 2",-1);
                      }
                      else if (*data == 0x30) {
                        pcVar7 = (*tclStubsPtr->tcl_GetString)(local_168);
                        pcVar7 = strstr(pcVar7,"06082a850307");
                        if (pcVar7 == (char *)0x0) {
                          pcVar7 = "1 2 643 2 2 19";
                        }
                        else {
                          pcVar7 = "1 2 643 7 1 1 1 1";
                        }
                        local_180 = (*tclStubsPtr->tcl_NewStringObj)(pcVar7,-1);
                      }
                      else {
                        tclpkcs11_pkinfo_cold_1();
                      }
                    }
                  }
                  else if (lVar2 < 0x251) {
                    if (lVar2 == 0x102) {
                      pTVar8 = tclpkcs11_bytearray_to_string
                                         ((uchar *)data,
                                          *(unsigned_long *)((long)&local_f8[0].type + lVar5));
                    }
                    else if (lVar2 == 0x250) {
                      local_158 = tclpkcs11_bytearray_to_string
                                            ((uchar *)data,
                                             *(unsigned_long *)((long)&local_f8[0].type + lVar5));
                    }
                  }
                  else if (lVar2 == 0x251) {
                    local_168 = tclpkcs11_bytearray_to_string
                                          ((uchar *)data,
                                           *(unsigned_long *)((long)&local_f8[0].type + lVar5));
                  }
                  else if (lVar2 == 0x252) {
                    local_150 = tclpkcs11_bytearray_to_string
                                          ((uchar *)data,
                                           *(unsigned_long *)((long)&local_f8[0].type + lVar5));
                  }
                  (*tclStubsPtr->tcl_Free)(*(char **)((long)local_f8 + lVar5 + -8));
                  *(undefined8 *)((long)local_f8 + lVar5 + -8) = 0;
                }
LAB_00106bad:
                lVar5 = lVar5 + 0x18;
                if (lVar5 == 0xd0) {
                  pTVar9 = (*tclStubsPtr->tcl_NewObj)();
                  p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar10 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_handle",-1);
                  (*p_Var3)((Tcl_Interp_conflict *)interp,pTVar9,pTVar10);
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)interp,pTVar9,pTVar6);
                  p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_slotid",-1);
                  (*p_Var3)((Tcl_Interp_conflict *)interp,pTVar9,pTVar6);
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)interp,pTVar9,local_148);
                  p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_id",-1);
                  (*p_Var3)((Tcl_Interp_conflict *)interp,pTVar9,pTVar6);
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)interp,pTVar9,pTVar8);
                  p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_label",-1);
                  (*p_Var3)((Tcl_Interp_conflict *)interp,pTVar9,pTVar6);
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)interp,pTVar9,local_170);
                  p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("pubkey",-1);
                  (*p_Var3)((Tcl_Interp_conflict *)interp,pTVar9,pTVar6);
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)interp,pTVar9,local_178);
                  p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("pubkey_algo",-1);
                  (*p_Var3)((Tcl_Interp_conflict *)interp,pTVar9,pTVar6);
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)interp,pTVar9,local_180);
                  p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("gostR3410params",-1);
                  (*p_Var3)((Tcl_Interp_conflict *)interp,pTVar9,pTVar6);
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)interp,pTVar9,local_158);
                  p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("gostR3411params",-1);
                  (*p_Var3)((Tcl_Interp_conflict *)interp,pTVar9,pTVar6);
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)interp,pTVar9,local_168);
                  p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("gost28147params",-1);
                  (*p_Var3)((Tcl_Interp_conflict *)interp,pTVar9,pTVar6);
                  (*tclStubsPtr->tcl_ListObjAppendElement)
                            ((Tcl_Interp_conflict *)interp,pTVar9,local_150);
                  p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("type",-1);
                  (*p_Var3)((Tcl_Interp_conflict *)interp,pTVar9,pTVar6);
                  p_Var3 = tclStubsPtr->tcl_ListObjAppendElement;
                  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11",-1);
                  (*p_Var3)((Tcl_Interp_conflict *)interp,pTVar9,pTVar6);
                  (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)interp,pTVar9);
                  return 0;
                }
              } while( true );
            }
            pPVar13 = tclStubsPtr->tcl_SetObjResult;
            pTVar6 = (*tclStubsPtr->tcl_NewStringObj)
                               ("FindObjects() from pkinfo returned a weird number of objects.",-1);
            goto LAB_00106851;
          }
          pPVar13 = tclStubsPtr->tcl_SetObjResult;
          pcVar7 = "PKCS11_ERROR MAYBE_LOGIN";
          goto LAB_0010673e;
        }
        pPVar13 = tclStubsPtr->tcl_SetObjResult;
      }
      else {
        CVar12 = (CK_RV)iVar4;
        pPVar13 = tclStubsPtr->tcl_SetObjResult;
      }
      pTVar6 = tclpkcs11_pkcs11_error(CVar12);
      goto LAB_00106749;
    }
    pPVar13 = tclStubsPtr->tcl_SetObjResult;
    pcVar7 = "invalid handle";
  }
  else {
    pPVar13 = tclStubsPtr->tcl_SetObjResult;
    pcVar7 = "wrong # args: should be \"pki::pkcs11::pkinfo handle slot pkcs11_id\"";
  }
LAB_0010673e:
  pTVar6 = (*tclStubsPtr->tcl_NewStringObj)(pcVar7,-1);
LAB_00106749:
  (*pPVar13)((Tcl_Interp_conflict *)interp,pTVar6);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_pkinfo(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  //fprintf(stderr, "PKIINFO START\n");
  return(tclpkcs11_perform_pki_pkinfo(cd, interp, objc, objv));
}